

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

bool __thiscall QTreeViewPrivate::hasVisibleChildren(QTreeViewPrivate *this,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  QTreeView *pQVar5;
  ulong uVar6;
  QTreeView *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int rowCount;
  QTreeView *q;
  ItemFlag in_stack_ffffffffffffffbc;
  int iVar7;
  bool local_11;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  QModelIndex::flags((QModelIndex *)in_RDI);
  local_c.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator&((QFlags<Qt::ItemFlag> *)in_RDI,in_stack_ffffffffffffffbc);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  if (IVar3 != 0) {
    local_11 = false;
    goto LAB_008f0f31;
  }
  pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
  uVar6 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,in_RSI);
  if ((uVar6 & 1) != 0) {
    bVar2 = QSet<QPersistentModelIndex>::isEmpty((QSet<QPersistentModelIndex> *)0x8f0e92);
    if (bVar2) {
      local_11 = true;
      goto LAB_008f0f31;
    }
    uVar6 = (**(code **)(*(long *)&(pQVar5->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x2c0))(pQVar5,in_RSI);
    if ((uVar6 & 1) != 0) {
      local_11 = false;
      goto LAB_008f0f31;
    }
    pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
    iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,in_RSI);
    for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + 1) {
      bVar2 = QTreeView::isRowHidden
                        (in_RSI,(int)((ulong)pQVar5 >> 0x20),(QModelIndex *)CONCAT44(iVar4,iVar7));
      if (!bVar2) {
        local_11 = true;
        goto LAB_008f0f31;
      }
    }
    if (iVar4 == 0) {
      local_11 = true;
      goto LAB_008f0f31;
    }
  }
  local_11 = false;
LAB_008f0f31:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

bool QTreeViewPrivate::hasVisibleChildren(const QModelIndex& parent) const
{
    Q_Q(const QTreeView);
    if (parent.flags() & Qt::ItemNeverHasChildren)
        return false;
    if (model->hasChildren(parent)) {
        if (hiddenIndexes.isEmpty())
            return true;
        if (q->isIndexHidden(parent))
            return false;
        int rowCount = model->rowCount(parent);
        for (int i = 0; i < rowCount; ++i) {
            if (!q->isRowHidden(i, parent))
                return true;
        }
        if (rowCount == 0)
            return true;
    }
    return false;
}